

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::CartesianProductGenerator<unsigned_int,_int,_unsigned_int>::
IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_>::~IteratorImpl
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  _Var1;
  _Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  _Var2;
  __uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  _Var3;
  
  (this->super_ParamIteratorInterface<std::tuple<unsigned_int,_int,_unsigned_int>_>).
  _vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_0103d2f8;
  this_00 = (this->current_value_).
            super___shared_ptr<std::tuple<unsigned_int,_int,_unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  _Var1.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>.
  _M_head_impl = (this->current_).
                 super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
                 .super__Head_base<0UL,_testing::internal::ParamIterator<unsigned_int>,_false>.
                 _M_head_impl.impl_._M_t.
                 super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                 .
                 super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>
  ;
  if (_Var1.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>.
      _M_head_impl != (ParamIteratorInterface<unsigned_int> *)0x0) {
    (**(code **)(*(long *)_Var1.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->current_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
  .super__Head_base<0UL,_testing::internal::ParamIterator<unsigned_int>,_false>._M_head_impl.impl_.
  _M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false> =
       (_Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>)0x0;
  _Var2.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl
       = (this->current_).
         super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
         .
         super__Tuple_impl<1UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
         .super__Head_base<1UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.impl_.
         _M_t.
         super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
         .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>;
  if (_Var2.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>.
      _M_head_impl != (ParamIteratorInterface<int> *)0x0) {
    (**(code **)(*(long *)_Var2.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->current_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
  .super__Head_base<1UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false> =
       (_Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>)0x0;
  _Var3._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>.
  _M_head_impl = *(tuple<testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                   *)&(this->current_).
                      super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
                      .
                      super__Tuple_impl<1UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
                      .super__Tuple_impl<2UL,_testing::internal::ParamIterator<unsigned_int>_>.
                      super__Head_base<2UL,_testing::internal::ParamIterator<unsigned_int>,_false>.
                      _M_head_impl.impl_._M_t;
  if ((__uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
       )_Var3._M_t.
        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
        .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>.
        _M_head_impl !=
      (__uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
       )0x0) {
    (**(code **)(*(long *)_Var3._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->current_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
  .super__Tuple_impl<2UL,_testing::internal::ParamIterator<unsigned_int>_>.
  super__Head_base<2UL,_testing::internal::ParamIterator<unsigned_int>,_false>._M_head_impl.impl_.
  _M_t = (__uniq_ptr_data<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>,_true,_true>
          )0x0;
  _Var1.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>.
  _M_head_impl = (this->end_).
                 super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
                 .super__Head_base<0UL,_testing::internal::ParamIterator<unsigned_int>,_false>.
                 _M_head_impl.impl_._M_t.
                 super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                 .
                 super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>
  ;
  if (_Var1.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>.
      _M_head_impl != (ParamIteratorInterface<unsigned_int> *)0x0) {
    (**(code **)(*(long *)_Var1.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->end_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
  .super__Head_base<0UL,_testing::internal::ParamIterator<unsigned_int>,_false>._M_head_impl.impl_.
  _M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false> =
       (_Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>)0x0;
  _Var2.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl
       = (this->end_).
         super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
         .
         super__Tuple_impl<1UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
         .super__Head_base<1UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.impl_.
         _M_t.
         super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
         .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>;
  if (_Var2.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>.
      _M_head_impl != (ParamIteratorInterface<int> *)0x0) {
    (**(code **)(*(long *)_Var2.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->end_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
  .super__Head_base<1UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false> =
       (_Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>)0x0;
  _Var3._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>.
  _M_head_impl = *(tuple<testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                   *)&(this->end_).
                      super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
                      .
                      super__Tuple_impl<1UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
                      .super__Tuple_impl<2UL,_testing::internal::ParamIterator<unsigned_int>_>.
                      super__Head_base<2UL,_testing::internal::ParamIterator<unsigned_int>,_false>.
                      _M_head_impl.impl_._M_t;
  if ((__uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
       )_Var3._M_t.
        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
        .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>.
        _M_head_impl !=
      (__uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
       )0x0) {
    (**(code **)(*(long *)_Var3._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->end_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
  .super__Tuple_impl<2UL,_testing::internal::ParamIterator<unsigned_int>_>.
  super__Head_base<2UL,_testing::internal::ParamIterator<unsigned_int>,_false>._M_head_impl.impl_.
  _M_t = (__uniq_ptr_data<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>,_true,_true>
          )0x0;
  _Var1.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>.
  _M_head_impl = (this->begin_).
                 super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
                 .super__Head_base<0UL,_testing::internal::ParamIterator<unsigned_int>,_false>.
                 _M_head_impl.impl_._M_t.
                 super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                 .
                 super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>
  ;
  if (_Var1.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>.
      _M_head_impl != (ParamIteratorInterface<unsigned_int> *)0x0) {
    (**(code **)(*(long *)_Var1.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->begin_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
  .super__Head_base<0UL,_testing::internal::ParamIterator<unsigned_int>,_false>._M_head_impl.impl_.
  _M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false> =
       (_Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>)0x0;
  _Var2.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl
       = (this->begin_).
         super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
         .
         super__Tuple_impl<1UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
         .super__Head_base<1UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.impl_.
         _M_t.
         super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
         .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>;
  if (_Var2.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>.
      _M_head_impl != (ParamIteratorInterface<int> *)0x0) {
    (**(code **)(*(long *)_Var2.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->begin_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
  .super__Head_base<1UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false> =
       (_Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>)0x0;
  _Var3._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>.
  _M_head_impl = *(tuple<testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                   *)&(this->begin_).
                      super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
                      .
                      super__Tuple_impl<1UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
                      .super__Tuple_impl<2UL,_testing::internal::ParamIterator<unsigned_int>_>.
                      super__Head_base<2UL,_testing::internal::ParamIterator<unsigned_int>,_false>.
                      _M_head_impl.impl_._M_t;
  if ((__uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
       )_Var3._M_t.
        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
        .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>.
        _M_head_impl !=
      (__uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
       )0x0) {
    (**(code **)(*(long *)_Var3._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->begin_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
  .super__Tuple_impl<2UL,_testing::internal::ParamIterator<unsigned_int>_>.
  super__Head_base<2UL,_testing::internal::ParamIterator<unsigned_int>,_false>._M_head_impl.impl_.
  _M_t = (__uniq_ptr_data<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>,_true,_true>
          )0x0;
  return;
}

Assistant:

~IteratorImpl() override {}